

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.hpp
# Opt level: O3

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,czstring cause,http_status_code error_no,czstring shortmsg,czstring longmsg)

{
  bool bVar1;
  char *__s;
  int iVar2;
  anon_class_24_3_4e63f42d f;
  long *plVar3;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *peVar4;
  http *this_00;
  char cVar5;
  ostream *poVar6;
  size_t sVar7;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> text;
  size_type sVar8;
  char cVar9;
  span<const_unsigned_char,__1L> *s;
  undefined4 in_register_0000008c;
  undefined1 auVar10 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string content_length;
  string status_line;
  string now;
  ostringstream content;
  array<std::pair<const_char_*,_const_char_*>,_5UL> h;
  long *local_2e8;
  index_type local_2e0;
  long local_2d8 [2];
  long *local_2c8;
  uint local_2c0;
  long local_2b8 [2];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *local_2a8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_2a0;
  http *local_288;
  string local_280;
  http **local_260;
  char **ppcStack_258;
  string *local_250;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  long *local_200;
  ostringstream local_1f8 [112];
  ios_base local_188 [264];
  char *local_80;
  long *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  pointer local_48;
  char *local_40;
  pointer local_38;
  
  __s = (char *)CONCAT44(in_register_0000008c,error_no);
  text._M_data = io._M_data;
  s = (span<const_unsigned_char,__1L> *)cause;
  local_2a8 = __return_storage_ptr__;
  local_288 = this;
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f8,
             "<!DOCTYPE html>\n<html lang=\"en\"><head>\n<meta charset=\"utf-8\">\n<title>",0x45);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"pstore-http",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f8," Error</title>\n</head>\n<body>\n<h1>",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"pstore-http",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f8," Web Server Error</h1>\n<p>",0x1a);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,(int)cause);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
  iVar2 = (int)poVar6;
  if (__s == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</p><p>",7);
  if (shortmsg == (czstring)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(shortmsg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,shortmsg,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
  if (io._M_data == (descriptor<pstore::details::posix_descriptor_traits> *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen((char *)io._M_data);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)io._M_data,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</p>\n<hr>\n<em>The ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"pstore-http",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," Web server</em>\n</body>\n</html>\n",0x21);
  std::__cxx11::stringbuf::str();
  auVar10 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_(&local_248,auVar10._0_8_,(duration)auVar10._8_8_);
  build_status_line_abi_cxx11_
            (&local_280,(http *)((ulong)cause & 0xffffffff),0x13ee4d,(czstring)text._M_data);
  cVar9 = '\x01';
  if (9 < local_228._M_string_length) {
    sVar8 = local_228._M_string_length;
    cVar5 = '\x04';
    do {
      cVar9 = cVar5;
      if (sVar8 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_0012ca01;
      }
      if (sVar8 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_0012ca01;
      }
      if (sVar8 < 10000) goto LAB_0012ca01;
      bVar1 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar5 = cVar9 + '\x04';
    } while (bVar1);
    cVar9 = cVar9 + '\x01';
  }
LAB_0012ca01:
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_2c8,local_2c0,local_228._M_string_length);
  this_00 = local_288;
  ppcStack_258 = &local_80;
  local_80 = "Content-length";
  local_78 = local_2c8;
  local_70 = "Connection";
  local_68 = "close";
  local_60 = "Content-type";
  local_58 = "text/html";
  local_50 = "Date";
  local_48 = local_248._M_dataplus._M_p;
  local_40 = "Last-Modified";
  local_38 = local_248._M_dataplus._M_p;
  local_260 = &local_288;
  local_2e8 = local_2d8;
  local_250 = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::__cxx11::string::append((char *)&local_2e8);
  plVar3 = local_2e8;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_208,local_2e0);
  local_200 = plVar3;
  send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (&local_2a0,this_00,sender,
             (descriptor<pstore::details::posix_descriptor_traits> *)local_208,s);
  peVar4 = local_2a8;
  f.h = (array<std::pair<const_char_*,_const_char_*>,_5UL> *)ppcStack_258;
  f.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              **)local_260;
  f.content_str = local_250;
  pstore::operator>>=(local_2a8,&local_2a0,f);
  if (local_2a0.has_error_ == false) {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_2a0);
  }
  else {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
              (&local_2a0);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1f8);
  std::ios_base::~ios_base(local_188);
  return peVar4;
}

Assistant:

error_or<IO> send_error_page (Sender sender, IO io, gsl::czstring const cause,
                                      http_status_code const error_no, gsl::czstring const shortmsg,
                                      gsl::czstring const longmsg) {
            using status_type = std::underlying_type_t<http_status_code>;
            std::ostringstream content;
            content << "<!DOCTYPE html>\n"
                       "<html lang=\"en\">"
                       "<head>\n"
                       "<meta charset=\"utf-8\">\n"
                       "<title>"
                    << server_name
                    << " Error</title>\n"
                       "</head>\n"
                       "<body>\n"
                       "<h1>"
                    << server_name
                    << " Web Server Error</h1>\n"
                       "<p>"
                    << static_cast<status_type> (error_no) << ": " << shortmsg
                    << "</p>"
                       "<p>"
                    << longmsg << ": " << cause
                    << "</p>\n"
                       "<hr>\n"
                       "<em>The "
                    << server_name
                    << " Web server</em>\n"
                       "</body>\n"
                       "</html>\n";
            std::string const & content_str = content.str ();

            auto const now = http_date (std::chrono::system_clock::now ());
            auto const status_line = build_status_line (error_no, "OK");

            auto const content_length = std::to_string (content_str.length ());
            std::array<czstring_pair, 5> const h{{
                {"Content-length", content_length.c_str ()},
                {"Connection", "close"}, // TODO remove this when we support persistent connections
                {"Content-type", "text/html"},
                {"Date", now.c_str ()},
                {"Last-Modified", now.c_str ()},
            }};

            // Send the three parts: the response line, the headers, and the HTML content.
            return send (sender, io, status_line + crlf) >>= [&] (IO io2) {
                return send (sender, io2, build_headers (std::begin (h), std::end (h))) >>=
                       [&] (IO io3) { return send (sender, io3, content_str); };
            };
        }